

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_stage,int p_col,int p_row,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  bool bVar14;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  (this->row).orig[p_stage] = p_row;
  (this->col).orig[p_stage] = p_col;
  (this->row).perm[p_row] = p_stage;
  (this->col).perm[p_col] = p_stage;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,1.0);
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems[0xe] = 0;
  local_d8.data._M_elems[0xf] = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_d8,&local_88,&val->m_backend);
  pnVar5 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x30);
  *(ulong *)puVar1 = CONCAT44(local_d8.data._M_elems[0xd],local_d8.data._M_elems[0xc]);
  *(ulong *)(puVar1 + 2) = CONCAT44(local_d8.data._M_elems[0xf],local_d8.data._M_elems[0xe]);
  puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x20);
  *(undefined8 *)puVar1 = local_d8.data._M_elems._32_8_;
  *(ulong *)(puVar1 + 2) = CONCAT44(local_d8.data._M_elems[0xb],local_d8.data._M_elems[10]);
  puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_d8.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_d8.data._M_elems._24_8_;
  *(undefined8 *)pnVar5[p_row].m_backend.data._M_elems = local_d8.data._M_elems._0_8_;
  *(undefined8 *)((long)pnVar5[p_row].m_backend.data._M_elems + 8) = local_d8.data._M_elems._8_8_;
  pnVar5[p_row].m_backend.exp = local_d8.exp;
  pnVar5[p_row].m_backend.neg = local_d8.neg;
  pnVar5[p_row].m_backend.fpclass = local_d8.fpclass;
  pnVar5[p_row].m_backend.prec_elem = local_d8.prec_elem;
  local_88.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_88.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_88.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_88.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_88.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_88.data._M_elems._40_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
  local_88.data._M_elems._48_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
  uVar6 = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
  local_88.data._M_elems._56_5_ = SUB85(uVar6,0);
  local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
  local_88.exp = (val->m_backend).exp;
  local_88.neg = (val->m_backend).neg;
  uVar6._0_4_ = (val->m_backend).fpclass;
  uVar6._4_4_ = (val->m_backend).prec_elem;
  if ((local_88.neg == true) &&
     (local_88.data._M_elems[0] != 0 || (fpclass_type)uVar6 != cpp_dec_float_finite)) {
    local_88.neg = false;
  }
  local_88._72_8_ = uVar6;
  a = Tolerances::epsilonPivot
                ((this->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (!NAN(a) && (fpclass_type)uVar6 != cpp_dec_float_NaN) {
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 0x10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems[6] = 0;
    local_d8.data._M_elems[7] = 0;
    local_d8.data._M_elems[8] = 0;
    local_d8.data._M_elems[9] = 0;
    local_d8.data._M_elems[10] = 0;
    local_d8.data._M_elems[0xb] = 0;
    local_d8.data._M_elems[0xc] = 0;
    local_d8.data._M_elems[0xd] = 0;
    local_d8.data._M_elems[0xe] = 0;
    local_d8.data._M_elems[0xf] = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_d8,a);
    iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_88,&local_d8);
    if (iVar13 < 0) {
      this->stat = SINGULAR;
    }
  }
  pnVar5 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8.exp = pnVar5[p_row].m_backend.exp;
  local_d8.neg = pnVar5[p_row].m_backend.neg;
  local_d8.fpclass = pnVar5[p_row].m_backend.fpclass;
  local_d8.prec_elem = pnVar5[p_row].m_backend.prec_elem;
  local_d8.data._M_elems._0_8_ = *(undefined8 *)pnVar5[p_row].m_backend.data._M_elems;
  local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)pnVar5[p_row].m_backend.data._M_elems + 8);
  puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x10);
  local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x20);
  local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  uVar6 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x30);
  uVar7 = *(undefined8 *)puVar1;
  uVar8 = *(undefined8 *)(puVar1 + 2);
  local_d8.data._M_elems[0xc] = (uint)uVar7;
  local_d8.data._M_elems[0xd] = (uint)((ulong)uVar7 >> 0x20);
  local_d8.data._M_elems[0xe] = (uint)uVar8;
  local_d8.data._M_elems[0xf] = (uint)((ulong)uVar8 >> 0x20);
  local_d8.data._M_elems[10] = (uint)uVar6;
  local_d8.data._M_elems[0xb] = (uint)((ulong)uVar6 >> 0x20);
  if ((local_d8.neg == true) &&
     (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite)) {
    local_d8.neg = false;
  }
  if ((local_d8.fpclass != cpp_dec_float_NaN) &&
     ((this->maxabs).m_backend.fpclass != cpp_dec_float_NaN)) {
    iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_d8,&(this->maxabs).m_backend);
    if (0 < iVar13) {
      pnVar5 = (this->diag).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = pnVar5[p_row].m_backend.data._M_elems[0];
      puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x30);
      uVar6 = *(undefined8 *)(puVar1 + 2);
      local_d8.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
      puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x24);
      uVar7 = *(undefined8 *)puVar1;
      uVar8 = *(undefined8 *)(puVar1 + 2);
      local_d8.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
      puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 0x14);
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar5[p_row].m_backend.data._M_elems + 4);
      uVar11 = *(undefined8 *)puVar1;
      uVar12 = *(undefined8 *)(puVar1 + 2);
      iVar13 = pnVar5[p_row].m_backend.exp;
      bVar14 = pnVar5[p_row].m_backend.neg;
      uVar2 = pnVar5[p_row].m_backend.fpclass;
      uVar3 = pnVar5[p_row].m_backend.prec_elem;
      if (bVar14 == true) {
        bVar14 = uVar2 == 0 && uVar4 == 0;
      }
      (this->maxabs).m_backend.data._M_elems[0] = uVar4;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 1) = uVar11;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 3) = uVar12;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 5) = uVar9;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 7) = uVar10;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 9) = uVar7;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 0xb) = uVar8;
      *(ulong *)((this->maxabs).m_backend.data._M_elems + 0xc) =
           CONCAT44(local_d8.data._M_elems[0xc],local_d8.data._M_elems[0xb]);
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 0xe) = uVar6;
      (this->maxabs).m_backend.exp = iVar13;
      (this->maxabs).m_backend.neg = bVar14;
      (this->maxabs).m_backend.fpclass = uVar2;
      (this->maxabs).m_backend.prec_elem = uVar3;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::setPivot(const int p_stage,
                            const int p_col,
                            const int p_row,
                            const R val)
{
   assert(row.perm[p_row] < 0);
   assert(col.perm[p_col] < 0);

   row.orig[p_stage] = p_row;
   col.orig[p_stage] = p_col;
   row.perm[p_row]   = p_stage;
   col.perm[p_col]   = p_stage;
   diag[p_row]       = R(1.0) / val;

   if(spxAbs(val) < _tolerances->epsilonPivot())
   {
#ifndef NDEBUG
      SPX_MSG_ERROR(std::cerr
                    << "LU pivot element is almost zero (< "
                    << _tolerances->epsilonPivot()
                    << ") - Basis is numerically singular"
                    << std::endl;)
#endif
      this->stat = SLinSolver<R>::SINGULAR;
   }

   if(spxAbs(diag[p_row]) > maxabs)
      maxabs = spxAbs(diag[p_row]);
}